

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O3

bool __thiscall S1Interval::InteriorContains(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  double dVar4;
  S2LogMessage SStack_18;
  
  if (ABS(p) <= 3.141592653589793) {
    dVar4 = (double)(~-(ulong)(p == -3.141592653589793) & (ulong)p |
                    -(ulong)(p == -3.141592653589793) & 0x400921fb54442d18);
    dVar1 = (this->bounds_).c_[0];
    dVar2 = (this->bounds_).c_[1];
    if (dVar1 <= dVar2) {
      if ((dVar4 <= dVar1) || (bVar3 = 1, dVar2 <= dVar4)) {
        bVar3 = -(dVar1 == -3.141592653589793) & -(dVar2 == 3.141592653589793);
      }
    }
    else {
      bVar3 = 1;
      if (dVar4 <= dVar1) {
        bVar3 = dVar4 < dVar2;
      }
    }
    return (bool)(bVar3 & 1);
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
             ,0x4f,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (fabs(p)) <= (3.14159265358979323846) ",0x34);
  abort();
}

Assistant:

bool S1Interval::InteriorContains(double p) const {
  // Works for empty, full, and singleton intervals.
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;

  if (is_inverted()) {
    return p > lo() || p < hi();
  } else {
    return (p > lo() && p < hi()) || is_full();
  }
}